

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int YUY2ToNV12(uint8_t *src_yuy2,int src_stride_yuy2,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_uv
              ,int dst_stride_uv,int width,int height)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  ulong __n;
  code *pcVar4;
  code *pcVar5;
  void *__src;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  int awidth;
  uint8_t *local_98;
  uint8_t *local_90;
  ulong uVar3;
  
  if (height == 0 ||
      (width < 1 ||
      (dst_uv == (uint8_t *)0x0 || (dst_y == (uint8_t *)0x0 || src_yuy2 == (uint8_t *)0x0)))) {
    iVar1 = -1;
  }
  else {
    if (height < 0) {
      src_yuy2 = src_yuy2 + ~height * src_stride_yuy2;
      src_stride_yuy2 = -src_stride_yuy2;
      height = -height;
    }
    iVar1 = libyuv::TestCpuFlag(0x20);
    bVar8 = (width & 0x1fU) == 0;
    pcVar4 = SplitUVRow_Any_AVX2;
    if (bVar8) {
      pcVar4 = SplitUVRow_AVX2;
    }
    pcVar5 = InterpolateRow_Any_AVX2;
    if (bVar8) {
      pcVar5 = InterpolateRow_AVX2;
    }
    bVar8 = (width & 0xfU) == 0;
    pcVar6 = SplitUVRow_Any_SSE2;
    if (bVar8) {
      pcVar6 = SplitUVRow_SSE2;
    }
    pcVar7 = InterpolateRow_Any_SSSE3;
    if (bVar8) {
      pcVar7 = InterpolateRow_SSSE3;
    }
    if (iVar1 == 0) {
      pcVar6 = SplitUVRow_C;
    }
    uVar2 = width + 1U & 0xfffffffe;
    uVar3 = (ulong)uVar2;
    iVar1 = libyuv::TestCpuFlag(0x400);
    if (iVar1 == 0) {
      pcVar4 = pcVar6;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    if (iVar1 == 0) {
      pcVar7 = InterpolateRow_C;
    }
    iVar1 = libyuv::TestCpuFlag(0x400);
    if (iVar1 == 0) {
      pcVar5 = pcVar7;
    }
    __ptr = malloc((ulong)(uVar2 * 3 + 0x3f));
    __src = (void *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    __n = (ulong)(uint)width;
    local_98 = dst_y;
    local_90 = dst_uv;
    for (iVar1 = 0; iVar1 < (int)(height - 1U); iVar1 = iVar1 + 2) {
      (*pcVar4)(src_yuy2,__src,(long)__src + uVar3,uVar3);
      memcpy(local_98,__src,__n);
      (*pcVar4)(src_yuy2 + src_stride_yuy2,__src,(void *)((long)__src + uVar3 * 2),uVar3);
      memcpy(local_98 + dst_stride_y,__src,__n);
      (*pcVar5)(local_90,(long)__src + uVar3,uVar3,uVar3,0x80);
      src_yuy2 = src_yuy2 + src_stride_yuy2 * 2;
      local_98 = local_98 + dst_stride_y * 2;
      local_90 = local_90 + dst_stride_uv;
    }
    if ((height & 1U) != 0) {
      (*pcVar4)(src_yuy2,__src,local_90,uVar3);
      memcpy(local_98,__src,__n);
    }
    free(__ptr);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int YUY2ToNV12(const uint8_t* src_yuy2,
               int src_stride_yuy2,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_uv,
               int dst_stride_uv,
               int width,
               int height) {
  int y;
  int halfwidth = (width + 1) >> 1;
  void (*SplitUVRow)(const uint8_t* src_uv, uint8_t* dst_u, uint8_t* dst_v,
                     int width) = SplitUVRow_C;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  if (!src_yuy2 || !dst_y || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_yuy2 = src_yuy2 + (height - 1) * src_stride_yuy2;
    src_stride_yuy2 = -src_stride_yuy2;
  }
#if defined(HAS_SPLITUVROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SplitUVRow = SplitUVRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_SSE2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    SplitUVRow = SplitUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SplitUVRow = SplitUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_NEON;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SplitUVRow = SplitUVRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SplitUVRow = SplitUVRow_MMI;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SplitUVRow = SplitUVRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_MSA;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif

  {
    int awidth = halfwidth * 2;
    // row of y and 2 rows of uv
    align_buffer_64(rows, awidth * 3);

    for (y = 0; y < height - 1; y += 2) {
      // Split Y from UV.
      SplitUVRow(src_yuy2, rows, rows + awidth, awidth);
      memcpy(dst_y, rows, width);
      SplitUVRow(src_yuy2 + src_stride_yuy2, rows, rows + awidth * 2, awidth);
      memcpy(dst_y + dst_stride_y, rows, width);
      InterpolateRow(dst_uv, rows + awidth, awidth, awidth, 128);
      src_yuy2 += src_stride_yuy2 * 2;
      dst_y += dst_stride_y * 2;
      dst_uv += dst_stride_uv;
    }
    if (height & 1) {
      // Split Y from UV.
      SplitUVRow(src_yuy2, rows, dst_uv, awidth);
      memcpy(dst_y, rows, width);
    }
    free_aligned_buffer_64(rows);
  }
  return 0;
}